

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_1::UserDefinedIOTest::UserDefinedIOTest
          (UserDefinedIOTest *this,TestContext *testCtx,string *name,string *description,
          CaseDefinition *caseDef)

{
  TopLevelObject *pTVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  IOBlock *pIVar5;
  Variable *pVVar6;
  ostream *poVar7;
  size_type sVar8;
  reference pvVar9;
  int precision;
  int precision_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  bool bVar10;
  uint local_124c;
  uint local_1248;
  uint local_1244;
  uint local_1240;
  uint local_117c;
  uint local_1178;
  uint local_1174;
  uint local_1170;
  bool local_1059;
  bool local_1019;
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f00;
  byte local_eda;
  allocator<char> local_ed9;
  Constants local_ed8 [2];
  string local_ed0;
  string local_eb0 [35];
  byte local_e8d;
  uint local_e8c;
  bool isArray_1;
  TopLevelObject *pTStack_e88;
  int numElements_1;
  TopLevelObject *input;
  undefined1 local_e78 [4];
  int tesInputNdx;
  string local_e38;
  allocator<char> local_e11;
  string local_e10;
  Variable local_df0;
  string local_da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  string local_d68;
  Constants local_d44;
  string local_d40;
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0;
  string local_ca0 [38];
  byte local_c7a;
  allocator<char> local_c79;
  Constants local_c78 [2];
  string local_c70;
  string local_c50 [35];
  byte local_c2d;
  uint local_c2c;
  bool isArray;
  TopLevelObject *pTStack_c28;
  int numElements;
  TopLevelObject *output;
  undefined1 local_c18 [4];
  int tcsOutputNdx;
  string local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> local_b98;
  SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> local_b88;
  SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> local_b78;
  SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> local_b68;
  allocator<char> local_b51;
  string local_b50;
  undefined1 local_b30 [8];
  Variable var1;
  string local_ae0;
  undefined1 local_ac0 [8];
  Variable var0;
  string local_a70;
  allocator<char> local_a49;
  string local_a48;
  SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> local_a28;
  undefined1 local_a12;
  allocator<char> local_a11;
  string local_a10;
  allocator<char> local_9e9;
  string local_9e8;
  SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> local_9c8;
  allocator<char> local_9b1;
  string local_9b0;
  Member local_990;
  VarType local_958;
  allocator<char> local_939;
  string local_938;
  Member local_918;
  VarType local_8e0;
  allocator<char> local_8c1;
  string local_8c0;
  Member local_8a0;
  allocator<char> local_861;
  string local_860;
  Member local_840;
  undefined1 local_801;
  undefined1 local_800 [7];
  bool useLightweightBlock;
  vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
  blockMembers;
  VarType local_7d0;
  VarType local_7b8;
  byte local_799;
  undefined1 local_798 [7];
  bool usedStruct;
  VarType structVarType;
  StructType *structType;
  VarType highpFloat;
  int local_728;
  int local_724;
  int tesNextInputLocation;
  int tcsNextOutputLocation;
  ostringstream tesStatements;
  ostringstream local_5a8 [8];
  ostringstream tesDeclarations;
  ostringstream local_430 [8];
  ostringstream tcsStatements;
  ostringstream local_2b8 [8];
  ostringstream tcsDeclarations;
  int wrongNumElements;
  bool useBlock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string inMaybePatch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string outMaybePatch;
  char *maybePatch;
  Constants local_68;
  byte local_64;
  allocator<char> local_63;
  byte local_62;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string vertexAttrArrayInputSize;
  bool isExplicitVertexArraySize;
  bool isPerPatchIO;
  CaseDefinition *caseDef_local;
  string *description_local;
  string *name_local;
  TestContext *testCtx_local;
  UserDefinedIOTest *this_local;
  
  TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UserDefinedIOTest_0166e640;
  CaseDefinition::CaseDefinition(&this->m_caseDef,caseDef);
  std::vector<glu::StructType,_std::allocator<glu::StructType>_>::vector(&this->m_structTypes);
  std::
  vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  ::vector(&this->m_tcsOutputs);
  std::
  vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
  ::vector(&this->m_tesInputs);
  std::__cxx11::string::string((string *)&this->m_tcsDeclarations);
  std::__cxx11::string::string((string *)&this->m_tcsStatements);
  std::__cxx11::string::string((string *)&this->m_tesDeclarations);
  std::__cxx11::string::string((string *)&this->m_tesStatements);
  local_1019 = true;
  if ((((this->m_caseDef).ioType != IO_TYPE_PER_PATCH) &&
      (local_1019 = true, (this->m_caseDef).ioType != IO_TYPE_PER_PATCH_ARRAY)) &&
     (local_1019 = true, (this->m_caseDef).ioType != IO_TYPE_PER_PATCH_BLOCK)) {
    local_1019 = (this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;
  }
  vertexAttrArrayInputSize.field_2._M_local_buf[0xb] = local_1019;
  local_1059 = true;
  if ((this->m_caseDef).vertexIOArraySize != VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN) {
    local_1059 = (this->m_caseDef).vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN;
  }
  vertexAttrArrayInputSize.field_2._M_local_buf[10] = local_1059;
  local_62 = 0;
  local_64 = 0;
  maybePatch._6_1_ = 0;
  if ((this->m_caseDef).vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_IMPLICIT) {
    std::allocator<char>::allocator();
    local_62 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"",&local_61);
  }
  else if ((this->m_caseDef).vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN) {
    std::allocator<char>::allocator();
    local_64 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,"gl_MaxPatchVertices",&local_63);
  }
  else if ((this->m_caseDef).vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN) {
    local_68 = MAX_TESSELLATION_PATCH_SIZE;
    de::toString<vkt::tessellation::(anonymous_namespace)::Constants>((string *)local_60,&local_68);
  }
  else {
    std::allocator<char>::allocator();
    maybePatch._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,(char *)0x0,(allocator<char> *)((long)&maybePatch + 7));
  }
  if ((maybePatch._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&maybePatch + 7));
  }
  if ((local_64 & 1) != 0) {
    std::allocator<char>::~allocator(&local_63);
  }
  if ((local_62 & 1) != 0) {
    std::allocator<char>::~allocator(&local_61);
  }
  pcVar4 = "";
  if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xb] & 1U) != 0) {
    pcVar4 = "patch ";
  }
  outMaybePatch.field_2._8_8_ = pcVar4;
  std::__cxx11::string::string((string *)(inMaybePatch.field_2._M_local_buf + 8));
  std::operator+(&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (inMaybePatch.field_2._M_local_buf + 8),(char *)outMaybePatch.field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_b8,"out ");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)(inMaybePatch.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&wrongNumElements);
  std::operator+(&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &wrongNumElements,(char *)outMaybePatch.field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 &local_118,"in ");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&wrongNumElements);
  bVar10 = true;
  if (((this->m_caseDef).ioType != IO_TYPE_PER_VERTEX_BLOCK) &&
     (bVar10 = true, (this->m_caseDef).ioType != IO_TYPE_PER_PATCH_BLOCK)) {
    bVar10 = (this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;
  }
  std::__cxx11::ostringstream::ostringstream(local_2b8);
  std::__cxx11::ostringstream::ostringstream(local_430);
  std::__cxx11::ostringstream::ostringstream(local_5a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tesNextInputLocation);
  local_724 = 2;
  local_728 = 2;
  glu::StructType::StructType((StructType *)((long)&highpFloat.m_data + 8),"S");
  std::vector<glu::StructType,_std::allocator<glu::StructType>_>::push_back
            (&this->m_structTypes,(value_type *)((long)&highpFloat.m_data + 8));
  glu::StructType::~StructType((StructType *)((long)&highpFloat.m_data + 8));
  glu::VarType::VarType((VarType *)&structType,TYPE_FLOAT,PRECISION_HIGHP);
  structVarType.m_data._8_8_ =
       std::vector<glu::StructType,_std::allocator<glu::StructType>_>::back(&this->m_structTypes);
  glu::VarType::VarType((VarType *)local_798,(StructType *)structVarType.m_data._8_8_);
  uVar2 = structVarType.m_data._8_8_;
  local_799 = 0;
  glu::VarType::VarType(&local_7b8,TYPE_INT,PRECISION_HIGHP);
  glu::StructType::addMember((StructType *)uVar2,"x",&local_7b8);
  glu::VarType::~VarType(&local_7b8);
  uVar2 = structVarType.m_data._8_8_;
  glu::VarType::VarType(&local_7d0,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember((StructType *)uVar2,"y",&local_7d0);
  glu::VarType::~VarType(&local_7d0);
  uVar2 = structVarType.m_data._8_8_;
  if (bVar10) {
    glu::VarType::VarType
              ((VarType *)
               &blockMembers.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(VarType *)&structType,2);
    glu::StructType::addMember
              ((StructType *)uVar2,"z",
               (VarType *)
               &blockMembers.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    glu::VarType::~VarType
              ((VarType *)
               &blockMembers.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
    ::vector((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
              *)local_800);
    local_801 = (this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;
    if (!(bool)local_801) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,"blockS",&local_861);
      IOBlock::Member::Member(&local_840,&local_860,(VarType *)local_798);
      std::
      vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
      ::push_back((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                   *)local_800,&local_840);
      IOBlock::Member::~Member(&local_840);
      std::__cxx11::string::~string((string *)&local_860);
      std::allocator<char>::~allocator(&local_861);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"blockFa",&local_8c1);
    glu::VarType::VarType(&local_8e0,(VarType *)&structType,3);
    IOBlock::Member::Member(&local_8a0,&local_8c0,&local_8e0);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
    ::push_back((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                 *)local_800,&local_8a0);
    IOBlock::Member::~Member(&local_8a0);
    glu::VarType::~VarType(&local_8e0);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator(&local_8c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"blockSa",&local_939);
    glu::VarType::VarType(&local_958,(VarType *)local_798,2);
    IOBlock::Member::Member(&local_918,&local_938,&local_958);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
    ::push_back((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                 *)local_800,&local_918);
    IOBlock::Member::~Member(&local_918);
    glu::VarType::~VarType(&local_958);
    std::__cxx11::string::~string((string *)&local_938);
    std::allocator<char>::~allocator(&local_939);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b0,"blockF",&local_9b1);
    IOBlock::Member::Member(&local_990,&local_9b0,(VarType *)&structType);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
    ::push_back((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                 *)local_800,&local_990);
    IOBlock::Member::~Member(&local_990);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::allocator<char>::~allocator(&local_9b1);
    pIVar5 = (IOBlock *)operator_new(0x60);
    local_a12 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"TheBlock",&local_9e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a10,"tcBlock",&local_a11);
    IOBlock::IOBlock(pIVar5,&local_9e8,&local_a10,
                     (vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                      *)local_800);
    local_a12 = 0;
    de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
              (&local_9c8,(TopLevelObject *)pIVar5);
    std::
    vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
    ::push_back(&this->m_tcsOutputs,&local_9c8);
    de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr(&local_9c8);
    std::__cxx11::string::~string((string *)&local_a10);
    std::allocator<char>::~allocator(&local_a11);
    std::__cxx11::string::~string((string *)&local_9e8);
    std::allocator<char>::~allocator(&local_9e9);
    pIVar5 = (IOBlock *)operator_new(0x60);
    var0._70_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a48,"TheBlock",&local_a49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a70,"teBlock",(allocator<char> *)&var0.field_0x47);
    IOBlock::IOBlock(pIVar5,&local_a48,&local_a70,
                     (vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                      *)local_800);
    var0._70_1_ = 0;
    de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
              (&local_a28,(TopLevelObject *)pIVar5);
    std::
    vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
    ::push_back(&this->m_tesInputs,&local_a28);
    de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr(&local_a28);
    std::__cxx11::string::~string((string *)&local_a70);
    std::allocator<char>::~allocator((allocator<char> *)&var0.field_0x47);
    std::__cxx11::string::~string((string *)&local_a48);
    std::allocator<char>::~allocator(&local_a49);
    local_799 = 1;
    std::
    vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
    ::~vector((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
               *)local_800);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae0,"in_te_s",(allocator<char> *)&var1.field_0x47);
    anon_unknown_1::Variable::Variable
              ((Variable *)local_ac0,&local_ae0,(VarType *)local_798,
               (this->m_caseDef).ioType != IO_TYPE_PER_PATCH);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::allocator<char>::~allocator((allocator<char> *)&var1.field_0x47);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b50,"in_te_f",&local_b51);
    anon_unknown_1::Variable::Variable
              ((Variable *)local_b30,&local_b50,(VarType *)&structType,
               (this->m_caseDef).ioType != IO_TYPE_PER_PATCH);
    std::__cxx11::string::~string((string *)&local_b50);
    std::allocator<char>::~allocator(&local_b51);
    if ((this->m_caseDef).ioType != IO_TYPE_PER_PATCH_ARRAY) {
      pVVar6 = (Variable *)operator_new(0x48);
      anon_unknown_1::Variable::Variable(pVVar6,(Variable *)local_ac0);
      de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
                (&local_b68,(TopLevelObject *)pVVar6);
      std::
      vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
      ::push_back(&this->m_tcsOutputs,&local_b68);
      de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr
                (&local_b68);
      pVVar6 = (Variable *)operator_new(0x48);
      anon_unknown_1::Variable::Variable(pVVar6,(Variable *)local_ac0);
      de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
                (&local_b78,(TopLevelObject *)pVVar6);
      std::
      vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
      ::push_back(&this->m_tesInputs,&local_b78);
      de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr
                (&local_b78);
      local_799 = 1;
    }
    pVVar6 = (Variable *)operator_new(0x48);
    anon_unknown_1::Variable::Variable(pVVar6,(Variable *)local_b30);
    de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
              (&local_b88,(TopLevelObject *)pVVar6);
    std::
    vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
    ::push_back(&this->m_tcsOutputs,&local_b88);
    de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr(&local_b88);
    pVVar6 = (Variable *)operator_new(0x48);
    anon_unknown_1::Variable::Variable(pVVar6,(Variable *)local_b30);
    de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
              (&local_b98,(TopLevelObject *)pVVar6);
    std::
    vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
    ::push_back(&this->m_tesInputs,&local_b98);
    de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::~SharedPtr(&local_b98);
    anon_unknown_1::Variable::~Variable((Variable *)local_b30);
    anon_unknown_1::Variable::~Variable((Variable *)local_ac0);
  }
  if ((local_799 & 1) != 0) {
    glu::declare((DeclareStructType *)local_c18,(StructType *)structVarType.m_data._8_8_,0);
    de::toString<glu::decl::DeclareStructType>(&local_bd8,(DeclareStructType *)local_c18);
    std::operator+(&local_bb8,&local_bd8,";\n");
    std::operator<<((ostream *)local_2b8,(string *)&local_bb8);
    std::__cxx11::string::~string((string *)&local_bb8);
    std::__cxx11::string::~string((string *)&local_bd8);
    glu::decl::DeclareStructType::~DeclareStructType((DeclareStructType *)local_c18);
  }
  poVar7 = std::operator<<((ostream *)local_430,"\t{\n");
  std::operator<<(poVar7,"\t\thighp float v = 1.3;\n");
  for (output._4_4_ = 0; iVar3 = output._4_4_,
      sVar8 = std::
              vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
              ::size(&this->m_tcsOutputs), iVar3 < (int)sVar8; output._4_4_ = output._4_4_ + 1) {
    pvVar9 = std::
             vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
             ::operator[](&this->m_tcsOutputs,(long)output._4_4_);
    pTStack_c28 = de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::operator*
                            (pvVar9);
    if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xb] & 1U) == 0) {
      local_1170 = 0xffffffff;
    }
    else {
      if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH) {
        local_1174 = 1;
      }
      else {
        if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_ARRAY) {
          local_1178 = 3;
        }
        else {
          if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK) {
            local_117c = 1;
          }
          else {
            local_117c = 0xfffffffe;
            if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
              local_117c = 2;
            }
          }
          local_1178 = local_117c;
        }
        local_1174 = local_1178;
      }
      local_1170 = local_1174;
    }
    local_c2c = local_1170;
    local_c2d = local_1170 != 1;
    poVar7 = std::operator<<((ostream *)local_2b8,"layout(location = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_724);
    std::operator<<(poVar7,") ");
    if ((local_c2d & 1) == 0) {
      poVar7 = std::operator<<((ostream *)local_2b8,(string *)local_98);
      (*pTStack_c28->_vptr_TopLevelObject[3])(local_ca0);
      std::operator<<(poVar7,local_ca0);
      std::__cxx11::string::~string(local_ca0);
    }
    else {
      poVar7 = std::operator<<((ostream *)local_2b8,(string *)local_98);
      pTVar1 = pTStack_c28;
      local_c7a = 0;
      if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_ARRAY) {
        local_c78[1] = 3;
        de::toString<vkt::tessellation::(anonymous_namespace)::Constants>(&local_c70,local_c78 + 1);
      }
      else if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
        local_c78[0] = NUM_PER_PATCH_BLOCKS;
        de::toString<vkt::tessellation::(anonymous_namespace)::Constants>(&local_c70,local_c78);
      }
      else {
        std::allocator<char>::allocator();
        local_c7a = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c70,"",&local_c79);
      }
      (*pTVar1->_vptr_TopLevelObject[4])(local_c50,pTVar1,&local_c70);
      std::operator<<(poVar7,local_c50);
      std::__cxx11::string::~string(local_c50);
      std::__cxx11::string::~string((string *)&local_c70);
      if ((local_c7a & 1) != 0) {
        std::allocator<char>::~allocator(&local_c79);
      }
    }
    iVar3 = (*pTStack_c28->_vptr_TopLevelObject[7])();
    local_724 = iVar3 + local_724;
    if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xb] & 1U) == 0) {
      poVar7 = std::operator<<((ostream *)local_430,"\t\tv += float(gl_InvocationID)*");
      iVar3 = (*pTStack_c28->_vptr_TopLevelObject[7])();
      de::floatToString_abi_cxx11_(&local_cc0,(de *)0x1,(float)iVar3 * 0.4,precision);
      poVar7 = std::operator<<(poVar7,(string *)&local_cc0);
      std::operator<<(poVar7,";\n");
      std::__cxx11::string::~string((string *)&local_cc0);
    }
    poVar7 = std::operator<<((ostream *)local_430,"\n\t\t// Assign values to output ");
    (*pTStack_c28->_vptr_TopLevelObject[2])(local_ce0);
    poVar7 = std::operator<<(poVar7,local_ce0);
    std::operator<<(poVar7,"\n");
    std::__cxx11::string::~string(local_ce0);
    if ((local_c2d & 1) == 0) {
      (*pTStack_c28->_vptr_TopLevelObject[6])(local_d20,pTStack_c28,2,glslAssignBasicTypeObject);
      std::operator<<((ostream *)local_430,local_d20);
      std::__cxx11::string::~string(local_d20);
    }
    else {
      (*pTStack_c28->_vptr_TopLevelObject[5])
                (local_d00,pTStack_c28,(ulong)local_c2c,2,glslAssignBasicTypeObject);
      std::operator<<((ostream *)local_430,local_d00);
      std::__cxx11::string::~string(local_d00);
    }
    if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xb] & 1U) == 0) {
      poVar7 = std::operator<<((ostream *)local_430,"\t\tv += float(");
      local_d44 = NUM_OUTPUT_VERTICES;
      de::toString<vkt::tessellation::(anonymous_namespace)::Constants>(&local_d40,&local_d44);
      poVar7 = std::operator<<(poVar7,(string *)&local_d40);
      poVar7 = std::operator<<(poVar7,"-gl_InvocationID-1)*");
      iVar3 = (*pTStack_c28->_vptr_TopLevelObject[7])();
      de::floatToString_abi_cxx11_(&local_d68,(de *)0x1,(float)iVar3 * 0.4,precision_00);
      poVar7 = std::operator<<(poVar7,(string *)&local_d68);
      std::operator<<(poVar7,";\n");
      std::__cxx11::string::~string((string *)&local_d68);
      std::__cxx11::string::~string((string *)&local_d40);
    }
  }
  std::operator<<((ostream *)local_430,"\t}\n");
  poVar7 = std::operator<<((ostream *)local_2b8,"\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e10,"in_tc_attr",&local_e11);
  anon_unknown_1::Variable::Variable(&local_df0,&local_e10,(VarType *)&structType,true);
  anon_unknown_1::Variable::declareArray(&local_da8,&local_df0,(string *)local_60);
  std::operator+(&local_d88,"layout(location = 0) in ",&local_da8);
  std::operator<<(poVar7,(string *)&local_d88);
  std::__cxx11::string::~string((string *)&local_d88);
  std::__cxx11::string::~string((string *)&local_da8);
  anon_unknown_1::Variable::~Variable(&local_df0);
  std::__cxx11::string::~string((string *)&local_e10);
  std::allocator<char>::~allocator(&local_e11);
  if ((local_799 & 1) != 0) {
    glu::declare((DeclareStructType *)local_e78,(StructType *)structVarType.m_data._8_8_,0);
    de::toString<glu::decl::DeclareStructType>(&local_e38,(DeclareStructType *)local_e78);
    poVar7 = std::operator<<((ostream *)local_5a8,(string *)&local_e38);
    std::operator<<(poVar7,";\n");
    std::__cxx11::string::~string((string *)&local_e38);
    glu::decl::DeclareStructType::~DeclareStructType((DeclareStructType *)local_e78);
  }
  poVar7 = std::operator<<((ostream *)&tesNextInputLocation,"\tbool allOk = true;\n");
  poVar7 = std::operator<<(poVar7,"\thighp uint firstFailedInputIndex = 0u;\n");
  poVar7 = std::operator<<(poVar7,"\t{\n");
  std::operator<<(poVar7,"\t\thighp float v = 1.3;\n");
  for (input._4_4_ = 0; iVar3 = input._4_4_,
      sVar8 = std::
              vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
              ::size(&this->m_tesInputs), iVar3 < (int)sVar8; input._4_4_ = input._4_4_ + 1) {
    pvVar9 = std::
             vector<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
             ::operator[](&this->m_tesInputs,(long)input._4_4_);
    pTStack_e88 = de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::operator*
                            (pvVar9);
    if ((vertexAttrArrayInputSize.field_2._M_local_buf[0xb] & 1U) == 0) {
      local_1240 = 5;
    }
    else {
      if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH) {
        local_1244 = 1;
      }
      else {
        if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK) {
          local_1248 = 1;
        }
        else {
          if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_ARRAY) {
            local_124c = 3;
          }
          else {
            local_124c = 0xfffffffe;
            if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
              local_124c = 2;
            }
          }
          local_1248 = local_124c;
        }
        local_1244 = local_1248;
      }
      local_1240 = local_1244;
    }
    local_e8c = local_1240;
    local_e8d = local_1240 != 1;
    poVar7 = std::operator<<((ostream *)local_5a8,"layout(location = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_728);
    std::operator<<(poVar7,") ");
    if ((local_e8d & 1) == 0) {
      (*pTStack_e88->_vptr_TopLevelObject[3])(&local_f20);
      std::operator+(&local_f00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     &local_f20);
      std::operator<<((ostream *)local_5a8,(string *)&local_f00);
      std::__cxx11::string::~string((string *)&local_f00);
      std::__cxx11::string::~string((string *)&local_f20);
    }
    else {
      poVar7 = std::operator<<((ostream *)local_5a8,(string *)local_f8);
      pTVar1 = pTStack_e88;
      local_eda = 0;
      if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_ARRAY) {
        local_ed8[1] = 3;
        de::toString<vkt::tessellation::(anonymous_namespace)::Constants>(&local_ed0,local_ed8 + 1);
      }
      else if ((this->m_caseDef).ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY) {
        local_ed8[0] = NUM_PER_PATCH_BLOCKS;
        de::toString<vkt::tessellation::(anonymous_namespace)::Constants>(&local_ed0,local_ed8);
      }
      else if ((vertexAttrArrayInputSize.field_2._M_local_buf[10] & 1U) == 0) {
        std::allocator<char>::allocator();
        local_eda = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ed0,"",&local_ed9);
      }
      else {
        de::toString<std::__cxx11::string>(&local_ed0,(de *)local_60,value);
      }
      (*pTVar1->_vptr_TopLevelObject[4])(local_eb0,pTVar1,&local_ed0);
      std::operator<<(poVar7,local_eb0);
      std::__cxx11::string::~string(local_eb0);
      std::__cxx11::string::~string((string *)&local_ed0);
      if ((local_eda & 1) != 0) {
        std::allocator<char>::~allocator(&local_ed9);
      }
    }
    iVar3 = (*pTStack_e88->_vptr_TopLevelObject[7])();
    local_728 = local_728 + iVar3;
    poVar7 = std::operator<<((ostream *)&tesNextInputLocation,"\n\t\t// Check values in input ");
    (*pTStack_e88->_vptr_TopLevelObject[2])(local_f40);
    poVar7 = std::operator<<(poVar7,local_f40);
    std::operator<<(poVar7,"\n");
    std::__cxx11::string::~string(local_f40);
    if ((local_e8d & 1) == 0) {
      (*pTStack_e88->_vptr_TopLevelObject[6])(local_f80,pTStack_e88,2,glslCheckBasicTypeObject);
      std::operator<<((ostream *)&tesNextInputLocation,local_f80);
      std::__cxx11::string::~string(local_f80);
    }
    else {
      (*pTStack_e88->_vptr_TopLevelObject[5])
                (local_f60,pTStack_e88,(ulong)local_e8c,2,glslCheckBasicTypeObject);
      std::operator<<((ostream *)&tesNextInputLocation,local_f60);
      std::__cxx11::string::~string(local_f60);
    }
  }
  std::operator<<((ostream *)&tesNextInputLocation,"\t}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_tcsDeclarations,local_fa0);
  std::__cxx11::string::~string(local_fa0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_tcsStatements,local_fc0);
  std::__cxx11::string::~string(local_fc0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_tesDeclarations,local_fe0);
  std::__cxx11::string::~string(local_fe0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_tesStatements,local_1000);
  std::__cxx11::string::~string(local_1000);
  glu::VarType::~VarType((VarType *)local_798);
  glu::VarType::~VarType((VarType *)&structType);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tesNextInputLocation);
  std::__cxx11::ostringstream::~ostringstream(local_5a8);
  std::__cxx11::ostringstream::~ostringstream(local_430);
  std::__cxx11::ostringstream::~ostringstream(local_2b8);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

UserDefinedIOTest::UserDefinedIOTest (tcu::TestContext& testCtx, const std::string& name, const std::string& description, const CaseDefinition caseDef)
	: TestCase	(testCtx, name, description)
	, m_caseDef	(caseDef)
{
	const bool			isPerPatchIO				= m_caseDef.ioType == IO_TYPE_PER_PATCH				||
													  m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		||
													  m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;

	const bool			isExplicitVertexArraySize	= m_caseDef.vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN ||
													  m_caseDef.vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN;

	const std::string	vertexAttrArrayInputSize	= m_caseDef.vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_IMPLICIT					? ""
													: m_caseDef.vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN	? "gl_MaxPatchVertices"
													: m_caseDef.vertexIOArraySize == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN			? de::toString(MAX_TESSELLATION_PATCH_SIZE)
													: DE_NULL;

	const char* const	maybePatch					= isPerPatchIO ? "patch " : "";
	const std::string	outMaybePatch				= std::string() + maybePatch + "out ";
	const std::string	inMaybePatch				= std::string() + maybePatch + "in ";
	const bool			useBlock					= m_caseDef.ioType == IO_TYPE_PER_VERTEX_BLOCK		||
													  m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		||
													  m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY;
	const int			wrongNumElements			= -2;

	std::ostringstream tcsDeclarations;
	std::ostringstream tcsStatements;
	std::ostringstream tesDeclarations;
	std::ostringstream tesStatements;

	// Indices 0 and 1 are taken, see initPrograms()
	int tcsNextOutputLocation = 2;
	int tesNextInputLocation  = 2;

	m_structTypes.push_back(glu::StructType("S"));

	const glu::VarType	highpFloat		(glu::TYPE_FLOAT, glu::PRECISION_HIGHP);
	glu::StructType&	structType		= m_structTypes.back();
	const glu::VarType	structVarType	(&structType);
	bool				usedStruct		= false;

	structType.addMember("x", glu::VarType(glu::TYPE_INT,		 glu::PRECISION_HIGHP));
	structType.addMember("y", glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

	// It is illegal to have a structure containing an array as an output variable
	if (useBlock)
		structType.addMember("z", glu::VarType(highpFloat, 2));

	if (useBlock)
	{
		std::vector<IOBlock::Member> blockMembers;

		// use leaner block to make sure it is not larger than allowed (per-patch storage is very limited)
		const bool useLightweightBlock = (m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY);

		if (!useLightweightBlock)
			blockMembers.push_back(IOBlock::Member("blockS",	structVarType));

		blockMembers.push_back(IOBlock::Member("blockFa",	glu::VarType(highpFloat, 3)));
		blockMembers.push_back(IOBlock::Member("blockSa",	glu::VarType(structVarType, 2)));
		blockMembers.push_back(IOBlock::Member("blockF",	highpFloat));

		m_tcsOutputs.push_back	(de::SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "tcBlock", blockMembers)));
		m_tesInputs.push_back	(de::SharedPtr<TopLevelObject>(new IOBlock("TheBlock", "teBlock", blockMembers)));

		usedStruct = true;
	}
	else
	{
		const Variable var0("in_te_s", structVarType,	m_caseDef.ioType != IO_TYPE_PER_PATCH);
		const Variable var1("in_te_f", highpFloat,		m_caseDef.ioType != IO_TYPE_PER_PATCH);

		if (m_caseDef.ioType != IO_TYPE_PER_PATCH_ARRAY)
		{
			// Arrays of structures are disallowed, add struct cases only if not arrayed variable
			m_tcsOutputs.push_back	(de::SharedPtr<TopLevelObject>(new Variable(var0)));
			m_tesInputs.push_back	(de::SharedPtr<TopLevelObject>(new Variable(var0)));

			usedStruct = true;
		}

		m_tcsOutputs.push_back	(de::SharedPtr<TopLevelObject>(new Variable(var1)));
		m_tesInputs.push_back	(de::SharedPtr<TopLevelObject>(new Variable(var1)));
	}

	if (usedStruct)
		tcsDeclarations << de::toString(glu::declare(structType)) + ";\n";

	tcsStatements << "\t{\n"
				  << "\t\thighp float v = 1.3;\n";

	for (int tcsOutputNdx = 0; tcsOutputNdx < static_cast<int>(m_tcsOutputs.size()); ++tcsOutputNdx)
	{
		const TopLevelObject&	output		= *m_tcsOutputs[tcsOutputNdx];
		const int				numElements	= !isPerPatchIO										? -1	//!< \note -1 means indexing with gl_InstanceID
											: m_caseDef.ioType == IO_TYPE_PER_PATCH				? 1
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
											: wrongNumElements;
		const bool				isArray		= (numElements != 1);

		DE_ASSERT(numElements != wrongNumElements);

		// \note: TCS output arrays are always implicitly-sized
		tcsDeclarations << "layout(location = " << tcsNextOutputLocation << ") ";
		if (isArray)
			tcsDeclarations << outMaybePatch << output.declareArray(m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY			? de::toString(NUM_PER_PATCH_ARRAY_ELEMS)
																  : m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? de::toString(NUM_PER_PATCH_BLOCKS)
																  : "");
		else
			tcsDeclarations << outMaybePatch << output.declare();

		tcsNextOutputLocation += output.numBasicSubobjectsInElementType();

		if (!isPerPatchIO)
			tcsStatements << "\t\tv += float(gl_InvocationID)*" << de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) << ";\n";

		tcsStatements << "\n\t\t// Assign values to output " << output.name() << "\n";
		if (isArray)
			tcsStatements << output.glslTraverseBasicTypeArray(numElements, 2, glslAssignBasicTypeObject);
		else
			tcsStatements << output.glslTraverseBasicType(2, glslAssignBasicTypeObject);

		if (!isPerPatchIO)
			tcsStatements << "\t\tv += float(" << de::toString(NUM_OUTPUT_VERTICES) << "-gl_InvocationID-1)*" << de::floatToString(0.4f * (float)output.numBasicSubobjectsInElementType(), 1) << ";\n";
	}
	tcsStatements << "\t}\n";

	tcsDeclarations << "\n"
					<< "layout(location = 0) in " + Variable("in_tc_attr", highpFloat, true).declareArray(vertexAttrArrayInputSize);

	if (usedStruct)
		tesDeclarations << de::toString(glu::declare(structType)) << ";\n";

	tesStatements << "\tbool allOk = true;\n"
				  << "\thighp uint firstFailedInputIndex = 0u;\n"
				  << "\t{\n"
				  << "\t\thighp float v = 1.3;\n";

	for (int tesInputNdx = 0; tesInputNdx < static_cast<int>(m_tesInputs.size()); ++tesInputNdx)
	{
		const TopLevelObject&	input		= *m_tesInputs[tesInputNdx];
		const int				numElements	= !isPerPatchIO										? NUM_OUTPUT_VERTICES
											: m_caseDef.ioType == IO_TYPE_PER_PATCH				? 1
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
											: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
											: wrongNumElements;
		const bool				isArray		= (numElements != 1);

		DE_ASSERT(numElements != wrongNumElements);

		tesDeclarations << "layout(location = " << tesNextInputLocation << ") ";
		if (isArray)
			tesDeclarations << inMaybePatch << input.declareArray(m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		? de::toString(NUM_PER_PATCH_ARRAY_ELEMS)
																: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? de::toString(NUM_PER_PATCH_BLOCKS)
																: isExplicitVertexArraySize							? de::toString(vertexAttrArrayInputSize)
																: "");
		else
			tesDeclarations << inMaybePatch + input.declare();

		tesNextInputLocation += input.numBasicSubobjectsInElementType();

		tesStatements << "\n\t\t// Check values in input " << input.name() << "\n";
		if (isArray)
			tesStatements << input.glslTraverseBasicTypeArray(numElements, 2, glslCheckBasicTypeObject);
		else
			tesStatements << input.glslTraverseBasicType(2, glslCheckBasicTypeObject);
	}
	tesStatements << "\t}\n";

	m_tcsDeclarations = tcsDeclarations.str();
	m_tcsStatements   = tcsStatements.str();
	m_tesDeclarations = tesDeclarations.str();
	m_tesStatements   = tesStatements.str();
}